

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O1

void mserialize::detail::
     BuiltinSerializer<std::map<int,_char,_std::less<int>,_std::allocator<std::pair<const_int,_char>_>_>,_void>
     ::serialize_elems<OutputStream>(long param_1,undefined8 param_2,undefined8 param_3)

{
  _Rb_tree_node_base *p_Var1;
  
  for (p_Var1 = *(_Rb_tree_node_base **)(param_1 + 0x18);
      p_Var1 != (_Rb_tree_node_base *)(param_1 + 8);
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    BuiltinSerializer<std::pair<int_const,char>,void>::serialize_elems<OutputStream,0ul,1ul>
              (p_Var1 + 1,param_3);
  }
  return;
}

Assistant:

static void serialize_elems(
    std::false_type /* no batch copy */,
    const Sequence& s, std::uint32_t /* size */, OutputStream& ostream
  )
  {
    for (auto&& elem : s)
    {
      mserialize::serialize<value_type>(elem, ostream);
    }
  }